

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::next_sibling(xml_node *this,char_t *name_)

{
  bool bVar1;
  xml_node_struct *pxVar2;
  
  if (this->_root == (xml_node_struct *)0x0) {
    pxVar2 = (xml_node_struct *)0x0;
  }
  else {
    pxVar2 = this->_root->next_sibling;
    while ((pxVar2 != (xml_node_struct *)0x0 &&
           ((pxVar2->name == (char_t *)0x0 ||
            (bVar1 = impl::anon_unknown_0::strequal(name_,pxVar2->name), !bVar1))))) {
      pxVar2 = pxVar2->next_sibling;
    }
  }
  return (xml_node)pxVar2;
}

Assistant:

PUGI__FN xml_node xml_node::next_sibling(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->next_sibling; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}